

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  undefined1 auVar1 [8];
  bool bVar2;
  XercesDOMParser *pXVar3;
  ostream *poVar4;
  code *pcVar5;
  char *pcVar6;
  XStr local_50;
  XStr local_48;
  undefined4 local_40;
  undefined1 local_30 [8];
  TypeInfo ti;
  bool passed;
  char **param_1_local;
  int param_0_local;
  
  ti.doc._7_1_ = 1;
  TypeInfo::TypeInfo((TypeInfo *)local_30);
  pXVar3 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)param_2);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar3,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  local_30 = (undefined1  [8])pXVar3;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar3);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(local_30[0]);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(local_30[0]);
  xercesc_4_0::AbstractDOMParser::setDoSchema(local_30[0]);
  xercesc_4_0::AbstractDOMParser::parse((char *)local_30);
  ti.parser = (XercesDOMParser *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (ti.parser == (XercesDOMParser *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"DOMTypeInfo test at line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x35c);
    poVar4 = std::operator<<(poVar4,"was not carried out");
    pcVar5 = std::endl<char,std::char_traits<char>>;
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    pcVar5 = (code *)0x1;
    bVar2 = TypeInfo::testInBuiltTypesOnAttributes((TypeInfo *)local_30,true);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testInBuiltTypesOnElements((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testSimpleDerived((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testComplexTypes((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testUnions((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testAnonymous((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testXsiTypes((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testAnys((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testInvaild((TypeInfo *)local_30);
    ti.doc._7_1_ = (ti.doc._7_1_ & 1 & bVar2) != 0;
  }
  if (local_30 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  pXVar3 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pcVar5);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar3,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  local_30 = (undefined1  [8])pXVar3;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar3);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(local_30[0]);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(local_30[0]);
  xercesc_4_0::AbstractDOMParser::setDoSchema(local_30[0]);
  auVar1 = local_30;
  XStr::XStr(&local_48,"SGXMLScanner");
  XStr::unicodeForm(&local_48);
  xercesc_4_0::AbstractDOMParser::useScanner((wchar16 *)auVar1);
  XStr::~XStr(&local_48);
  xercesc_4_0::AbstractDOMParser::parse((char *)local_30);
  ti.parser = (XercesDOMParser *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (ti.parser == (XercesDOMParser *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"DOMTypeInfo test at line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x37e);
    poVar4 = std::operator<<(poVar4,"was not carried out");
    pcVar5 = std::endl<char,std::char_traits<char>>;
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    pcVar5 = (code *)0x0;
    bVar2 = TypeInfo::testInBuiltTypesOnAttributes((TypeInfo *)local_30,false);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testInBuiltTypesOnElements((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testSimpleDerived((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testComplexTypes((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testUnions((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testAnonymous((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testXsiTypes((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testAnys((TypeInfo *)local_30);
    ti.doc._7_1_ = bVar2 & ti.doc._7_1_;
    bVar2 = TypeInfo::testInvaild((TypeInfo *)local_30);
    ti.doc._7_1_ = (ti.doc._7_1_ & 1 & bVar2) != 0;
  }
  if (local_30 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  pXVar3 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pcVar5);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar3,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  local_30 = (undefined1  [8])pXVar3;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar3);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(local_30[0]);
  pcVar6 = "data/TypeInfoJustDTD.xml";
  xercesc_4_0::AbstractDOMParser::parse((char *)local_30);
  ti.parser = (XercesDOMParser *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (ti.parser == (XercesDOMParser *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"DOMTypeInfo test at line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x396);
    poVar4 = std::operator<<(poVar4,"was not carried out");
    pcVar5 = std::endl<char,std::char_traits<char>>;
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar6 = (char *)pcVar5;
  }
  else {
    bVar2 = TypeInfo::testDTD((TypeInfo *)local_30);
    ti.doc._7_1_ = (ti.doc._7_1_ & 1 & bVar2) != 0;
  }
  if (local_30 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  pXVar3 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pcVar6);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar3,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  local_30 = (undefined1  [8])pXVar3;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar3);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(local_30[0]);
  auVar1 = local_30;
  XStr::XStr(&local_50,"DGXMLScanner");
  XStr::unicodeForm(&local_50);
  xercesc_4_0::AbstractDOMParser::useScanner((wchar16 *)auVar1);
  XStr::~XStr(&local_50);
  pcVar6 = "data/TypeInfoJustDTD.xml";
  xercesc_4_0::AbstractDOMParser::parse((char *)local_30);
  ti.parser = (XercesDOMParser *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (ti.parser == (XercesDOMParser *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"DOMTypeInfo test at line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3af);
    poVar4 = std::operator<<(poVar4,"was not carried out");
    pcVar5 = std::endl<char,std::char_traits<char>>;
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar6 = (char *)pcVar5;
  }
  else {
    bVar2 = TypeInfo::testDTD((TypeInfo *)local_30);
    ti.doc._7_1_ = (ti.doc._7_1_ & 1 & bVar2) != 0;
  }
  if (local_30 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  pXVar3 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pcVar6);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar3,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  local_30 = (undefined1  [8])pXVar3;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar3);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(local_30[0]);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(local_30[0]);
  xercesc_4_0::AbstractDOMParser::setDoSchema(local_30[0]);
  xercesc_4_0::AbstractDOMParser::parse((char *)local_30);
  ti.parser = (XercesDOMParser *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (ti.parser == (XercesDOMParser *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"DOMTypeInfo test at line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3c7);
    poVar4 = std::operator<<(poVar4,"was not carried out");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    bVar2 = TypeInfo::combinedTest((TypeInfo *)local_30);
    ti.doc._7_1_ = (ti.doc._7_1_ & 1 & bVar2) != 0;
  }
  if (local_30 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  if ((ti.doc._7_1_ & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"test failed");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    param_1_local._4_4_ = 4;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Test Run Successfully");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    param_1_local._4_4_ = 0;
  }
  local_40 = 1;
  TypeInfo::~TypeInfo((TypeInfo *)local_30);
  return param_1_local._4_4_;
}

Assistant:

int main(int /*argc*/, char ** /*argv*/)
{
    bool passed = true;

    TypeInfo ti;

    try {
        //first the combined DTD/Schema scanner
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->setDoNamespaces(true);
        ti.parser->setDoSchema(true);
        ti.parser->parse("data/TypeInfo.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/TypeInfo.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &= ti.testInBuiltTypesOnAttributes(true);
        passed &= ti.testInBuiltTypesOnElements();
        passed &= ti.testSimpleDerived();
        passed &= ti.testComplexTypes();
        passed &= ti.testUnions();
        passed &= ti.testAnonymous();
        passed &= ti.testXsiTypes();
        passed &= ti.testAnys();
        passed &= ti.testInvaild();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;

    //lets do the same for the just schema scanner
    try {
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->setDoNamespaces(true);
        ti.parser->setDoSchema(true);
        ti.parser->useScanner(X("SGXMLScanner"));
        ti.parser->parse("data/TypeInfoNoDTD.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/TypeInfoNoDTD.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &= ti.testInBuiltTypesOnAttributes(false);
        passed &= ti.testInBuiltTypesOnElements();
        passed &= ti.testSimpleDerived();
        passed &= ti.testComplexTypes();
        passed &= ti.testUnions();
        passed &= ti.testAnonymous();
        passed &= ti.testXsiTypes();
        passed &= ti.testAnys();
        passed &= ti.testInvaild();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;


    //now default for DTD
    try {
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->parse("data/TypeInfoJustDTD.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/TypeInfoJustDTD.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &= ti.testDTD();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;


    //and specific scanner
    try {
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->useScanner(X("DGXMLScanner"));
        ti.parser->parse("data/TypeInfoJustDTD.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/TypeInfoJustDTD.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &=  ti.testDTD();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;

    try {
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->setDoNamespaces(true);
        ti.parser->setDoSchema(true);
        ti.parser->parse("data/combined.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/combined.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &= ti.combinedTest();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;

    if (!passed) {
        std::cerr << "test failed" << std::endl;
        return 4;
    }

    std::cerr << "Test Run Successfully" << std::endl;
    return 0;
}